

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_export.c
# Opt level: O0

REF_STATUS ref_export_smesh(REF_GRID ref_grid,char *filename)

{
  uint uVar1;
  REF_STATUS RVar2;
  REF_STATUS ref_private_macro_code_rss;
  REF_INT mark;
  REF_INT attr;
  REF_INT dim;
  REF_INT cell;
  REF_INT node_per;
  REF_INT nodes [27];
  REF_INT ntri;
  REF_INT nnode;
  REF_INT *n2o;
  REF_INT *o2n;
  REF_CELL pRStack_38;
  REF_INT node;
  REF_CELL ref_cell;
  REF_NODE ref_node;
  FILE *file;
  char *filename_local;
  REF_GRID ref_grid_local;
  
  ref_cell = (REF_CELL)ref_grid->node;
  file = (FILE *)filename;
  filename_local = (char *)ref_grid;
  ref_node = (REF_NODE)fopen(filename,"w");
  if ((FILE *)ref_node == (FILE *)0x0) {
    printf("unable to open %s\n",file);
  }
  if (ref_node == (REF_NODE)0x0) {
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_export.c",0x465,
           "ref_export_smesh","unable to open file");
    ref_grid_local._4_4_ = 2;
  }
  else {
    fprintf((FILE *)ref_node,"%d  %d  %d  %d\n",(ulong)ref_cell->type,3,0,0);
    uVar1 = ref_node_compact((REF_NODE)ref_cell,&n2o,(REF_INT **)&ntri);
    if (uVar1 == 0) {
      for (o2n._4_4_ = 0; (int)o2n._4_4_ < (int)ref_cell->type; o2n._4_4_ = o2n._4_4_ + 1) {
        fprintf((FILE *)ref_node,"%d  %.16e  %.16e  %.16e\n",
                *(undefined8 *)(ref_cell->c2n + (long)(_ntri[(int)o2n._4_4_] * 0xf) * 2),
                *(undefined8 *)(ref_cell->c2n + (long)(_ntri[(int)o2n._4_4_] * 0xf + 1) * 2),
                *(undefined8 *)(ref_cell->c2n + (long)(_ntri[(int)o2n._4_4_] * 0xf + 2) * 2),
                (ulong)o2n._4_4_);
      }
      pRStack_38 = *(REF_CELL *)(filename_local + 0x28);
      uVar1 = pRStack_38->node_per;
      nodes[0x1a] = pRStack_38->n;
      fprintf((FILE *)ref_node,"%d  %d\n",(ulong)(uint)nodes[0x1a],1);
      for (attr = 0; attr < pRStack_38->max; attr = attr + 1) {
        RVar2 = ref_cell_nodes(pRStack_38,attr,&cell);
        if (RVar2 == 0) {
          fprintf((FILE *)ref_node,"%d  %d %d %d  %d\n",(ulong)uVar1,(ulong)(uint)n2o[cell],
                  (ulong)(uint)n2o[node_per],(ulong)(uint)n2o[nodes[0]],nodes[1]);
        }
      }
      fprintf((FILE *)ref_node,"0\n0\n");
      if (_ntri != (REF_INT *)0x0) {
        free(_ntri);
      }
      if (n2o != (REF_INT *)0x0) {
        free(n2o);
      }
      fclose((FILE *)ref_node);
      ref_grid_local._4_4_ = 0;
    }
    else {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_export.c",
             0x46f,"ref_export_smesh",(ulong)uVar1,"compact");
      ref_grid_local._4_4_ = uVar1;
    }
  }
  return ref_grid_local._4_4_;
}

Assistant:

REF_FCN static REF_STATUS ref_export_smesh(REF_GRID ref_grid,
                                           const char *filename) {
  FILE *file;
  REF_NODE ref_node;
  REF_CELL ref_cell;
  REF_INT node;
  REF_INT *o2n, *n2o;
  REF_INT nnode, ntri;
  REF_INT nodes[REF_CELL_MAX_SIZE_PER];
  REF_INT node_per, cell;
  REF_INT dim, attr, mark;
  ref_node = ref_grid_node(ref_grid);

  file = fopen(filename, "w");
  if (NULL == (void *)file) printf("unable to open %s\n", filename);
  RNS(file, "unable to open file");

  nnode = ref_node_n(ref_node);

  dim = 3;
  attr = 0;
  mark = 0;

  fprintf(file, "%d  %d  %d  %d\n", nnode, dim, attr, mark);

  RSS(ref_node_compact(ref_node, &o2n, &n2o), "compact");

  for (node = 0; node < ref_node_n(ref_node); node++)
    fprintf(file, "%d  %.16e  %.16e  %.16e\n", node,
            ref_node_xyz(ref_node, 0, n2o[node]),
            ref_node_xyz(ref_node, 1, n2o[node]),
            ref_node_xyz(ref_node, 2, n2o[node]));

  ref_cell = ref_grid_tri(ref_grid);
  node_per = ref_cell_node_per(ref_cell);
  ntri = ref_cell_n(ref_cell);

  mark = 1;
  fprintf(file, "%d  %d\n", ntri, mark);

  each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
    fprintf(file, "%d  %d %d %d  %d\n", node_per, o2n[nodes[0]], o2n[nodes[1]],
            o2n[nodes[2]], nodes[3]);
  }

  fprintf(file, "0\n0\n");

  ref_free(n2o);
  ref_free(o2n);

  fclose(file);

  return REF_SUCCESS;
}